

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O0

bool __thiscall utf8stream::seek(utf8stream *this,offset off,int whence)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 local_428 [4];
  int skipped;
  uchar skip [512];
  uchar skip_1 [512];
  offset oStack_20;
  int whence_local;
  offset off_local;
  utf8stream *this_local;
  
  if (((this->writing & 1U) == 0) && ((this->reading & 1U) != 0)) {
    if (whence == 2) {
      do {
        iVar1 = (*(this->super_stream)._vptr_stream[9])(this,skip + 0x1f8,0x200);
      } while (iVar1 == 0x200);
      this_local._7_1_ = off == 0;
    }
    else {
      oStack_20 = off;
      if (whence == 1) {
        oStack_20 = this->pos + off;
      }
      if (oStack_20 < this->pos) {
        if ((oStack_20 < 0) ||
           (uVar2 = (*this->file->_vptr_stream[6])(this->file,0,0), (uVar2 & 1) == 0)) {
          return false;
        }
        this->buflen = 0;
        this->bufcarry = 0;
        this->bufread = 0;
        this->pos = 0;
        checkheader(this);
      }
      else {
        oStack_20 = oStack_20 - this->pos;
      }
      for (; 0 < oStack_20; oStack_20 = oStack_20 - (int)uVar3) {
        uVar3 = min<long>(oStack_20,0x200);
        iVar1 = (*(this->super_stream)._vptr_stream[9])(this,local_428,uVar3 & 0xffffffff);
        if (iVar1 != (int)uVar3) {
          stopreading(this);
          return false;
        }
      }
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool seek(offset off, int whence)
    {
        if(writing || !reading) return false;

        if(whence == SEEK_END)
        {
            uchar skip[512];
            while(read(skip, sizeof(skip)) == sizeof(skip));
            return !off;
        }
        else if(whence == SEEK_CUR) off += pos;

        if(off >= pos) off -= pos;
        else if(off < 0 || !file->seek(0, SEEK_SET)) return false;
        else
        {
            bufread = bufcarry = buflen = 0;
            pos = 0;
            checkheader();
        }

        uchar skip[512];
        while(off > 0)
        {
            int skipped = (int)min(off, (offset)sizeof(skip));
            if(read(skip, skipped) != skipped) { stopreading(); return false; }
            off -= skipped;
        }

        return true;
    }